

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

char * jx9ExtractDirName(char *zPath,int nByte,int *pLen)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (zPath + lVar4 + (long)nByte + -1 <= zPath) break;
    lVar2 = lVar4 + -1;
  } while (zPath[lVar4 + (long)nByte + -1] != '/');
  iVar3 = nByte + -1 + (int)lVar4;
  *pLen = iVar3;
  if ((1 - (long)nByte == lVar4) && (*zPath != '/')) {
    pcVar1 = "..";
  }
  else {
    if (iVar3 != 0) {
      return zPath;
    }
    pcVar1 = "./";
  }
  *pLen = 1;
  return pcVar1 + 1;
}

Assistant:

JX9_PRIVATE const char * jx9ExtractDirName(const char *zPath, int nByte, int *pLen)
{
	const char *zEnd = &zPath[nByte - 1];
	int c, d;
	c = d = '/';
#ifdef __WINNT__
	d = '\\';
#endif
	while( zEnd > zPath && ( (int)zEnd[0] != c && (int)zEnd[0] != d ) ){
		zEnd--;
	}
	*pLen = (int)(zEnd-zPath);
#ifdef __WINNT__
	if( (*pLen) == (int)sizeof(char) && zPath[0] == '/' ){
		/* Normalize path on windows */
		return "\\";
	}
#endif
	if( zEnd == zPath && ( (int)zEnd[0] != c && (int)zEnd[0] != d) ){
		/* No separator, return "." as the current directory */
		*pLen = sizeof(char);
		return ".";
	}
	if( (*pLen) == 0 ){
		*pLen = sizeof(char);
#ifdef __WINNT__
		return "\\";
#else
		return "/";
#endif
	}
	return zPath;
}